

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O2

int sprng256_forget(keccak_sponge *sponge)

{
  ulong __n;
  int iVar1;
  void *__s;
  ulong __n_00;
  uint64_t uVar2;
  
  if (sponge == (keccak_sponge *)0x0) {
    iVar1 = -1;
  }
  else if (sponge->position < 0x88) {
    if (sponge->flags == 0xbf0420879da9f2d9) {
      keccakf(sponge);
      uVar2 = 0;
      __n_00 = 0x40;
      while (sponge->position = uVar2, __n_00 != 0) {
        __n = 0x88 - uVar2;
        __s = (void *)((long)sponge->a + uVar2);
        if (__n_00 < __n) {
          memset(__s,0,__n_00);
          uVar2 = __n_00 + sponge->position;
          __n_00 = 0;
        }
        else {
          memset(__s,0,__n);
          keccakf(sponge);
          uVar2 = 0;
          __n_00 = __n_00 - __n;
        }
      }
      _shake_pad(sponge);
      iVar1 = 0;
      if (sponge->position != 0) {
        keccakf(sponge);
        sponge->position = 0;
      }
    }
    else {
      iVar1 = 2;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int sprng256_forget(keccak_sponge* const __restrict sponge) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (sponge->position >= sponge_rate) {
    return SPONGERR_INVARIANT;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  // Apply the permutation; we then are at position zero.
  keccakf(sponge->a);
  sponge->position = 0;

  // Write sponge_security_strength zero bytes. In this case,
  // this is equivalent to:
  //    memset(sponge->a, 0, 32);
  //    sponge->position = 32;
  _sponge_forget(sponge, sponge_security_strength);

  // Apply padding.
  _shake_pad(sponge);
  if (sponge->position == 0) {
    // The permutation was applied because of the padding rule.
    return 0;
  }

  // The permutation has not yet been applied, so apply it.
  keccakf(sponge->a);
  sponge->position = 0;

  return 0;
}